

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

int callbinTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  byte bVar1;
  uint uVar2;
  TValue *f;
  
  f = luaT_gettmbyobj(L,p1,event);
  if ((f->tt_ & 0xf) == 0) {
    f = luaT_gettmbyobj(L,p2,event);
  }
  if ((f->tt_ & 0xf) == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    bVar1 = luaT_callTMres(L,f,p1,p2,res);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

static int callbinTM (lua_State *L, const TValue *p1, const TValue *p2,
                      StkId res, TMS event) {
  const TValue *tm = luaT_gettmbyobj(L, p1, event);  /* try first operand */
  if (notm(tm))
    tm = luaT_gettmbyobj(L, p2, event);  /* try second operand */
  if (notm(tm))
    return -1;  /* tag method not found */
  else  /* call tag method and return the tag of the result */
    return luaT_callTMres(L, tm, p1, p2, res);
}